

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

int isSelectionEvent(Display *display,XEvent *event,XPointer pointer)

{
  bool local_21;
  XPointer pointer_local;
  XEvent *event_local;
  Display *display_local;
  uint local_4;
  
  if ((event->xany).window == _glfw.x11.helperWindowHandle) {
    local_21 = true;
    if ((event->type != 0x1e) && (local_21 = true, event->type != 0x1f)) {
      local_21 = event->type == 0x1d;
    }
    local_4 = (uint)local_21;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static Bool isSelectionEvent(Display* display, XEvent* event, XPointer pointer)
{
    if (event->xany.window != _glfw.x11.helperWindowHandle)
        return False;

    return event->type == SelectionRequest ||
           event->type == SelectionNotify ||
           event->type == SelectionClear;
}